

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O2

bool __thiscall GdlSetAttrItem::IsMarkedKeySlot(GdlSetAttrItem *this)

{
  pointer ppGVar1;
  bool bVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar3 = 0;
  do {
    uVar4 = (ulong)uVar3;
    ppGVar1 = (this->m_vpavs).
              super__Vector_base<GdlAttrValueSpec_*,_std::allocator<GdlAttrValueSpec_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    uVar5 = (long)(this->m_vpavs).
                  super__Vector_base<GdlAttrValueSpec_*,_std::allocator<GdlAttrValueSpec_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish - (long)ppGVar1 >> 3;
    if (uVar5 <= uVar4) break;
    bVar2 = GdlAttrValueSpec::IsKeySlotAttr(ppGVar1[uVar4]);
    uVar3 = uVar3 + 1;
  } while (!bVar2);
  return uVar4 < uVar5;
}

Assistant:

bool GdlSetAttrItem::IsMarkedKeySlot()
{
	for (unsigned int iavs = 0; iavs < m_vpavs.size(); iavs++)
	{
		if (m_vpavs[iavs]->IsKeySlotAttr())
			return true;
	}
	return false;
}